

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

bool __thiscall QBlitterPaintEngine::begin(QBlitterPaintEngine *this,QPaintDevice *pdev)

{
  bool bVar1;
  QBlitterPaintEnginePrivate *pQVar2;
  QPaintDevice *in_RSI;
  bool ok;
  QBlitterPaintEnginePrivate *d;
  QRasterPaintEngine *in_stack_00000028;
  
  pQVar2 = d_func((QBlitterPaintEngine *)0x55bf60);
  bVar1 = QRasterPaintEngine::begin(in_stack_00000028,(QPaintDevice *)this);
  (pQVar2->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.super_QPaintEnginePrivate.
  pdev = in_RSI;
  return bVar1;
}

Assistant:

bool QBlitterPaintEngine::begin(QPaintDevice *pdev)
{
    Q_D(QBlitterPaintEngine);
    bool ok = QRasterPaintEngine::begin(pdev);
#ifdef QT_BLITTER_RASTEROVERLAY
    d->pmData->unmergeOverlay();
#endif
    d->pdev = pdev;
    return ok;
}